

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O0

void __thiscall CLIListener::do_fetch(CLIListener *this,Poll *p,string *arg)

{
  uint64_t cmd_seq;
  string *this_00;
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  element_type *peVar4;
  OnError local_198;
  reference_wrapper<Poll> local_178;
  CLIListener *local_170;
  code *local_168;
  undefined8 local_160;
  type local_158;
  OnResponse local_110;
  shared_ptr<Subscriber> local_f0;
  undefined1 local_e0 [8];
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  Simple dto;
  mapped_type addr;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_28;
  string *local_20;
  string *arg_local;
  Poll *p_local;
  CLIListener *this_local;
  
  local_20 = arg;
  arg_local = (string *)p;
  p_local = (Poll *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->file_server,arg);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->file_server);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Could not find a server to fetch from, execute search first");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->file_server,local_20);
    addr.field_2._8_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->file_server);
    bVar1 = std::__detail::operator==
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)((long)&addr.field_2 + 8));
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Not found file ");
      poVar2 = std::operator<<(poVar2,(string *)local_20);
      poVar2 = std::operator<<(poVar2," in search results");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->file_server,local_20);
      std::__cxx11::string::string
                ((string *)(dto.payload.field_2._M_local_buf + 8),(string *)pmVar3);
      cmd_seq = this->cmd_seq;
      this->cmd_seq = cmd_seq + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"GET",&local_b9);
      ::dto::create((Simple *)local_98,cmd_seq,&local_b8,local_20);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::
      make_shared<MultiQuery<dto::Simple,dto::Complex>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int_const&>
                ((Simple *)local_e0,(unsigned_short *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->port,
                 (int *)(dto.payload.field_2._M_local_buf + 8));
      this_00 = arg_local;
      std::shared_ptr<Subscriber>::shared_ptr<MultiQuery<dto::Simple,dto::Complex>,void>
                (&local_f0,(shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> *)local_e0);
      Poll::subscribe((Poll *)this_00,&local_f0);
      std::shared_ptr<Subscriber>::~shared_ptr(&local_f0);
      peVar4 = std::
               __shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e0);
      local_168 = on_fetch_result;
      local_160 = 0;
      local_170 = this;
      local_178 = std::ref<Poll>((Poll *)arg_local);
      std::
      bind<void(CLIListener::*)(Poll&,dto::Complex&,sockaddr_in,std::__cxx11::string,unsigned_short),CLIListener*,std::reference_wrapper<Poll>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::__cxx11::string&,unsigned_short&>
                (&local_158,(offset_in_CLIListener_to_subr *)&local_168,&local_170,&local_178,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&dto.payload.field_2 + 8),&this->port);
      std::function<void(dto::Complex&,sockaddr_in)>::
      function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string,unsigned_short))(Poll&,dto::Complex&,sockaddr_in,std::__cxx11::string,unsigned_short)>,void>
                ((function<void(dto::Complex&,sockaddr_in)> *)&local_110,&local_158);
      MultiQuery<dto::Simple,_dto::Complex>::when_response(peVar4,&local_110);
      std::function<void_(dto::Complex_&,_sockaddr_in)>::~function(&local_110);
      std::
      _Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>
      ::~_Bind(&local_158);
      peVar4 = std::
               __shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e0);
      std::function<void()>::function<void(&)(),void>((function<void()> *)&local_198,request_failed)
      ;
      MultiQuery<dto::Simple,_dto::Complex>::when_error(peVar4,&local_198);
      std::function<void_()>::~function(&local_198);
      std::shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_>::~shared_ptr
                ((shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> *)local_e0);
      ::dto::Simple::~Simple((Simple *)local_98);
      std::__cxx11::string::~string((string *)(dto.payload.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void CLIListener::do_fetch(Poll &p, std::string &arg) {
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Could not find a server to fetch from, execute search first" << std::endl;
    return;
  }
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Not found file " << arg << " in search results" << std::endl;
    return;
  }
  auto addr = file_server[arg];
  auto dto = dto::create(cmd_seq++, "GET", arg);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, addr, LONG_TIMEOUT_MILLIS);
  p.subscribe(query);
  query->when_response(std::bind(&CLIListener::on_fetch_result, this, std::ref(p), _1, _2, addr, port));
  query->when_error(request_failed);
}